

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::AdvancedPipelinePreVS::Cleanup(AdvancedPipelinePreVS *this)

{
  CallLogWrapper *this_00;
  int i;
  long lVar1;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  lVar1 = 0;
  glu::CallLogWrapper::glUseProgram(this_00,0);
  do {
    glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_vertex_buffer);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_vertex_array);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glUseProgram(0);
		for (int i = 0; i < 2; ++i)
			glDeleteProgram(m_program[i]);
		glDeleteBuffers(1, &m_vertex_buffer);
		glDeleteVertexArrays(1, &m_vertex_array);
		return NO_ERROR;
	}